

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

void generate_reset_token(st_quicly_default_encrypt_cid_t *self,void *token,void *cid)

{
  st_ptls_cipher_context_t *psVar1;
  ulong __n;
  uint8_t expandbuf [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  psVar1 = self->reset_token_ctx;
  if (psVar1->algo->block_size != 0x10) {
    __assert_fail("self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,99,
                  "void generate_reset_token(struct st_quicly_default_encrypt_cid_t *, void *, const void *)"
                 );
  }
  __n = self->cid_encrypt_ctx->algo->block_size;
  if (__n != 0x10) {
    if (0xf < __n) {
      __assert_fail("self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0x67,
                    "void generate_reset_token(struct st_quicly_default_encrypt_cid_t *, void *, const void *)"
                   );
    }
    local_28 = 0;
    uStack_20 = 0;
    memcpy(&local_28,cid,__n);
    cid = &local_28;
  }
  (*psVar1->do_transform)(psVar1,token,cid,0x10);
  return;
}

Assistant:

static void generate_reset_token(struct st_quicly_default_encrypt_cid_t *self, void *token, const void *cid)
{
    uint8_t expandbuf[QUICLY_STATELESS_RESET_TOKEN_LEN];

    assert(self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN);

    /* expand the input to full size, if CID is shorter than the size of the reset token */
    if (self->cid_encrypt_ctx->algo->block_size != QUICLY_STATELESS_RESET_TOKEN_LEN) {
        assert(self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN);
        memset(expandbuf, 0, sizeof(expandbuf));
        memcpy(expandbuf, cid, self->cid_encrypt_ctx->algo->block_size);
        cid = expandbuf;
    }

    /* transform */
    ptls_cipher_encrypt(self->reset_token_ctx, token, cid, QUICLY_STATELESS_RESET_TOKEN_LEN);
}